

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O1

void duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  unsigned_long *puVar8;
  float *pfVar9;
  data_ptr_t pdVar10;
  list_entry_t *plVar11;
  data_ptr_t pdVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var14;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  pointer pcVar15;
  byte bVar20;
  anon_class_24_3_3d016869 fun;
  anon_class_24_3_3d016869 fun_00;
  anon_class_24_3_3d016869 fun_01;
  anon_class_24_3_3d016869 fun_02;
  anon_class_24_3_3d016869 fun_03;
  anon_class_24_3_3d016869 fun_04;
  anon_class_24_3_3d016869 fun_05;
  anon_class_24_3_3d016869 fun_06;
  anon_class_24_3_3d016869 fun_07;
  anon_class_24_3_3d016869 fun_08;
  anon_class_24_3_3d016869 fun_09;
  anon_class_24_3_3d016869 fun_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  data_ptr_t pdVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  bool bVar25;
  BoundFunctionExpression *pBVar26;
  reference vec;
  reference vec_00;
  idx_t iVar27;
  idx_t count;
  Vector *this_00;
  Vector *this_01;
  idx_t iVar28;
  TemplatedValidityData<unsigned_long> *pTVar29;
  SelectionVector *pSVar30;
  _Head_base<0UL,_unsigned_long_*,_false> _Var31;
  undefined1 *puVar32;
  InvalidInputException *pIVar33;
  SelectionVector *pSVar34;
  ulong uVar35;
  unsigned_long uVar36;
  long lVar37;
  SelectionVector *pSVar38;
  ValidityMask *other;
  ValidityMask *in_R8;
  idx_t in_R9;
  string *psVar39;
  data_ptr_t pdVar40;
  idx_t idx_in_entry;
  uint64_t *puVar41;
  ulong uVar42;
  float fVar43;
  list_entry_t left;
  list_entry_t left_00;
  list_entry_t left_01;
  list_entry_t left_02;
  list_entry_t left_03;
  list_entry_t left_04;
  list_entry_t left_05;
  list_entry_t lVar44;
  list_entry_t right;
  list_entry_t right_00;
  list_entry_t right_01;
  list_entry_t right_02;
  list_entry_t right_03;
  list_entry_t right_04;
  list_entry_t right_05;
  list_entry_t right_06;
  UnifiedVectorFormat ldata;
  float *rhs_data;
  float *lhs_data;
  SelectionVector *local_198;
  uint64_t *local_188;
  SelectionVector *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  data_ptr_t local_130;
  undefined1 local_128 [16];
  SelectionVector local_118 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  DataChunk *local_d8;
  idx_t local_d0;
  UnifiedVectorFormat local_c8;
  float *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar26 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  local_198 = (SelectionVector *)args->count;
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_d8 = args;
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  iVar27 = ListVector::GetListSize(vec);
  count = ListVector::GetListSize(vec_00);
  this_00 = ListVector::GetEntry(vec);
  this_01 = ListVector::GetEntry(vec_00);
  Vector::Flatten(this_00,iVar27);
  Vector::Flatten(this_01,count);
  FlatVector::VerifyFlatVector(this_00);
  iVar28 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_00->validity).super_TemplatedValidityMask<unsigned_long>,iVar27);
  if (iVar28 != iVar27) {
    pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._0_8_ = local_118;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"%s: left argument can not contain NULL values","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar15 = (pBVar26->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar15,
               pcVar15 + (pBVar26->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar33,(string *)local_128,&local_50);
    __cxa_throw(pIVar33,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  FlatVector::VerifyFlatVector(this_01);
  iVar27 = TemplatedValidityMask<unsigned_long>::CountValid
                     (&(this_01->validity).super_TemplatedValidityMask<unsigned_long>,count);
  if (iVar27 != count) {
    pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_128._0_8_ = local_118;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"%s: right argument can not contain NULL values","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar15 = (pBVar26->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
              _M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar15,
               pcVar15 + (pBVar26->function).super_BaseScalarFunction.super_SimpleFunction.
                         super_Function.name._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar33,(string *)local_128,&local_70);
    __cxa_throw(pIVar33,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  psVar39 = &(pBVar26->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  local_78 = (undefined1  [8])this_00->data;
  local_80 = (float *)this_01->data;
  VVar2 = vec->vector_type;
  VVar3 = vec_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pfVar9 = (float *)result->data;
    if (((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) &&
       ((puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar8 == (unsigned_long *)0x0 || ((*puVar8 & 1) != 0)))) {
      fun.lhs_data = (float **)local_78;
      fun.func_name = psVar39;
      fun.rhs_data = &local_80;
      fVar43 = BinaryLambdaWrapperWithNulls::
               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                         (fun,*(list_entry_t *)vec->data,*(list_entry_t *)vec_00->data,in_R8,in_R9);
      *pfVar9 = fVar43;
      goto LAB_01be00ef;
    }
  }
  else {
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar10 = vec->data;
      plVar11 = (list_entry_t *)vec_00->data;
      puVar8 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)local_198;
        if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = local_198;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          _Var31._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = local_198;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_128,(unsigned_long **)&vec->validity,(unsigned_long *)&local_c8
                    );
          uVar24 = local_128._8_8_;
          uVar23 = local_128._0_8_;
          local_128._0_8_ = (SelectionVector *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar23;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
          }
          pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var31._M_head_impl =
               (pTVar29->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var31._M_head_impl;
        if (_Var31._M_head_impl == (unsigned_long *)0x0) {
          if (local_198 != (SelectionVector *)0x0) {
            lVar44 = *plVar11;
            local_188 = (uint64_t *)(pdVar10 + 8);
            pSVar38 = (SelectionVector *)0x0;
            do {
              fun_03.lhs_data = (float **)local_78;
              fun_03.func_name = psVar39;
              fun_03.rhs_data = &local_80;
              left_02.length = *local_188;
              left_02.offset = local_188[-1];
              fVar43 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_03,left_02,lVar44,in_R8,in_R9);
              *(float *)(pdVar12 + (long)pSVar38 * 4) = fVar43;
              pSVar38 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
              local_188 = local_188 + 2;
            } while (local_198 != pSVar38);
          }
        }
        else {
          puVar32 = (undefined1 *)
                    ((long)&local_198[2].selection_data.internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar32) {
            uVar35 = 0;
            pSVar38 = (SelectionVector *)0x0;
            do {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                uVar36 = 0xffffffffffffffff;
              }
              else {
                uVar36 = puVar8[uVar35];
              }
              pSVar30 = (SelectionVector *)
                        &pSVar38[2].selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
              if (local_198 <= pSVar30) {
                pSVar30 = local_198;
              }
              pSVar34 = pSVar30;
              if (uVar36 != 0) {
                pSVar34 = pSVar38;
                if (uVar36 == 0xffffffffffffffff) {
                  if (pSVar38 < pSVar30) {
                    lVar44 = *plVar11;
                    puVar41 = (uint64_t *)(pdVar10 + (long)pSVar38 * 0x10 + 8);
                    do {
                      fun_01.lhs_data = (float **)local_78;
                      fun_01.func_name = psVar39;
                      fun_01.rhs_data = &local_80;
                      left_00.length = *puVar41;
                      left_00.offset = puVar41[-1];
                      fVar43 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_01,left_00,lVar44,in_R8,in_R9);
                      *(float *)(pdVar12 + (long)pSVar34 * 4) = fVar43;
                      pSVar34 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar34->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar41 = puVar41 + 2;
                    } while (pSVar30 != pSVar34);
                  }
                }
                else if (pSVar38 < pSVar30) {
                  puVar41 = (uint64_t *)(pdVar10 + (long)pSVar38 * 0x10 + 8);
                  uVar42 = 0;
                  do {
                    if ((uVar36 >> (uVar42 & 0x3f) & 1) != 0) {
                      fun_02.lhs_data = (float **)local_78;
                      fun_02.func_name = psVar39;
                      fun_02.rhs_data = &local_80;
                      left_01.length = *puVar41;
                      left_01.offset = puVar41[-1];
                      fVar43 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_02,left_01,*plVar11,in_R8,in_R9);
                      *(float *)(pdVar12 + uVar42 * 4 + (long)pSVar38 * 4) = fVar43;
                    }
                    uVar42 = uVar42 + 1;
                    puVar41 = puVar41 + 2;
                  } while ((long)pSVar38 + (uVar42 - (long)pSVar30) != 0);
                  pSVar34 = (SelectionVector *)
                            ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    )._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t + uVar42);
                }
              }
              uVar35 = uVar35 + 1;
              pSVar38 = pSVar34;
            } while (uVar35 != (ulong)puVar32 >> 6);
          }
        }
        goto LAB_01be00ef;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar10 = vec->data;
          pdVar12 = vec_00->data;
          local_128._0_8_ = psVar39;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
          local_118[0].sel_vector = (sel_t *)&local_80;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar40 = result->data;
          FlatVector::VerifyFlatVector(result);
          this = &result->validity;
          FlatVector::VerifyFlatVector(vec);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)local_198;
          local_148 = local_198;
          if ((vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            _Var31._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_c8,(unsigned_long **)&vec->validity,
                       (unsigned_long *)&local_148);
            pdVar22 = local_c8.data;
            pSVar38 = local_c8.sel;
            local_c8.sel = (SelectionVector *)0x0;
            local_c8.data = (data_ptr_t)0x0;
            p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar38;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar22;
            if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
            }
            pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var31._M_head_impl =
                 (pTVar29->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var31._M_head_impl;
          FlatVector::VerifyFlatVector(vec_00);
          other = &vec_00->validity;
          if (_Var31._M_head_impl == (unsigned_long *)0x0) {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (idx_t)local_198;
            if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_148 = local_198;
              if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
              }
              _Var31._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_148 = local_198;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_c8,(unsigned_long **)other,(unsigned_long *)&local_148);
              pdVar22 = local_c8.data;
              pSVar38 = local_c8.sel;
              local_c8.sel = (SelectionVector *)0x0;
              local_c8.data = (data_ptr_t)0x0;
              p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                        internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar38;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar22;
              if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.data);
              }
              pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var31._M_head_impl =
                   (pTVar29->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            (this->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var31._M_head_impl;
          }
          else {
            ValidityMask::Combine(this,other,(idx_t)local_198);
          }
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (local_198 != (SelectionVector *)0x0) {
              lVar37 = 0;
              do {
                fun_10.lhs_data = (float **)local_128._8_8_;
                fun_10.func_name = (string *)local_128._0_8_;
                fun_10.rhs_data = (float **)local_118[0].sel_vector;
                lVar44.length = *(uint64_t *)(pdVar10 + lVar37 * 4 + 8);
                lVar44.offset = *(uint64_t *)(pdVar10 + lVar37 * 4);
                right_06.length = *(uint64_t *)(pdVar12 + lVar37 * 4 + 8);
                right_06.offset = *(uint64_t *)(pdVar12 + lVar37 * 4);
                fVar43 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_10,lVar44,right_06,in_R8,in_R9);
                *(float *)(pdVar40 + lVar37) = fVar43;
                lVar37 = lVar37 + 4;
                local_198 = (SelectionVector *)
                            ((long)&local_198[-1].selection_data.internal.
                                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 7);
              } while (local_198 != (SelectionVector *)0x0);
            }
          }
          else {
            puVar32 = (undefined1 *)
                      ((long)&local_198[2].selection_data.internal.
                              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 7);
            if ((undefined1 *)0x3f < puVar32) {
              uVar35 = 0;
              pSVar38 = (SelectionVector *)0x0;
              local_130 = pdVar40;
              do {
                pdVar22 = local_130;
                puVar8 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar8 == (unsigned_long *)0x0) {
                  uVar36 = 0xffffffffffffffff;
                }
                else {
                  uVar36 = puVar8[uVar35];
                }
                pSVar30 = (SelectionVector *)
                          &pSVar38[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (local_198 <= pSVar30) {
                  pSVar30 = local_198;
                }
                pSVar34 = pSVar30;
                if (uVar36 != 0) {
                  pSVar34 = pSVar38;
                  if (uVar36 == 0xffffffffffffffff) {
                    if (pSVar38 < pSVar30) {
                      lVar37 = (long)pSVar38 * 4 + 2;
                      do {
                        fun_08.lhs_data = (float **)local_128._8_8_;
                        fun_08.func_name = (string *)local_128._0_8_;
                        fun_08.rhs_data = (float **)local_118[0].sel_vector;
                        left_04.length = *(uint64_t *)(pdVar10 + lVar37 * 4);
                        left_04.offset = *(uint64_t *)(pdVar10 + lVar37 * 4 + -8);
                        right_04.length = *(uint64_t *)(pdVar12 + lVar37 * 4);
                        right_04.offset = *(uint64_t *)(pdVar12 + lVar37 * 4 + -8);
                        fVar43 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                           (fun_08,left_04,right_04,in_R8,in_R9);
                        *(float *)(pdVar40 + (long)pSVar38 * 4) = fVar43;
                        pSVar38 = (SelectionVector *)
                                  ((long)&(((unsafe_unique_array<unsigned_long> *)
                                           &pSVar38->sel_vector)->
                                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                          )._M_t.
                                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                          ._M_t + 1);
                        lVar37 = lVar37 + 4;
                        pSVar34 = pSVar38;
                      } while (pSVar30 != pSVar38);
                    }
                  }
                  else {
                    pdVar40 = local_130;
                    if (pSVar38 < pSVar30) {
                      lVar37 = (long)pSVar38 * 4 + 2;
                      uVar42 = 0;
                      do {
                        if ((uVar36 >> (uVar42 & 0x3f) & 1) != 0) {
                          fun_09.lhs_data = (float **)local_128._8_8_;
                          fun_09.func_name = (string *)local_128._0_8_;
                          fun_09.rhs_data = (float **)local_118[0].sel_vector;
                          left_05.length = *(uint64_t *)(pdVar10 + lVar37 * 4);
                          left_05.offset = *(uint64_t *)(pdVar10 + lVar37 * 4 + -8);
                          right_05.length = *(uint64_t *)(pdVar12 + lVar37 * 4);
                          right_05.offset = *(uint64_t *)(pdVar12 + lVar37 * 4 + -8);
                          fVar43 = BinaryLambdaWrapperWithNulls::
                                   Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                             (fun_09,left_05,right_05,in_R8,in_R9);
                          *(float *)(pdVar22 + uVar42 * 4 + (long)pSVar38 * 4) = fVar43;
                        }
                        uVar42 = uVar42 + 1;
                        lVar37 = lVar37 + 4;
                      } while ((long)pSVar38 + (uVar42 - (long)pSVar30) != 0);
                      pSVar34 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + uVar42);
                      pdVar40 = local_130;
                    }
                  }
                }
                uVar35 = uVar35 + 1;
                pSVar38 = pSVar34;
              } while (uVar35 != (ulong)puVar32 >> 6);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_128);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c8);
          Vector::ToUnifiedFormat(vec,(idx_t)local_198,(UnifiedVectorFormat *)local_128);
          Vector::ToUnifiedFormat(vec_00,(idx_t)local_198,&local_c8);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = local_c8.data;
          pSVar38 = local_c8.sel;
          uVar24 = local_128._8_8_;
          uVar23 = local_128._0_8_;
          pdVar10 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 && (float **)local_118[0].sel_vector == (float **)0x0) {
            if (local_198 != (SelectionVector *)0x0) {
              lVar37 = *(long *)uVar23;
              _Var14._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              pSVar38 = (SelectionVector *)0x0;
              do {
                pSVar30 = pSVar38;
                if (lVar37 != 0) {
                  pSVar30 = (SelectionVector *)(ulong)*(uint *)(lVar37 + (long)pSVar38 * 4);
                }
                pSVar34 = pSVar38;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var14._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar34 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var14._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar38 * 4);
                }
                uVar4 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar30 * 0x10))
                        ->_M_use_count;
                uVar16 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar30 * 0x10))
                         ->_M_weak_count;
                left.length._4_4_ = uVar16;
                left.length._0_4_ = uVar4;
                uVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar34 * 0x10))->_M_use_count;
                uVar17 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar34 * 0x10))->_M_weak_count;
                right.length._4_4_ = uVar17;
                right.length._0_4_ = uVar5;
                fun_00.lhs_data = (float **)local_78;
                fun_00.func_name = psVar39;
                fun_00.rhs_data = &local_80;
                left.offset = (uint64_t)
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (uVar24 + pSVar30 * 0x10))->_vptr__Sp_counted_base;
                right.offset = (uint64_t)
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)pdVar12 + pSVar34 * 0x10))->_vptr__Sp_counted_base;
                fVar43 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_00,left,right,in_R8,in_R9);
                *(float *)(pdVar10 + (long)pSVar38 * 4) = fVar43;
                pSVar38 = (SelectionVector *)
                          ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  )._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t + 1);
              } while (local_198 != pSVar38);
            }
          }
          else if (local_198 != (SelectionVector *)0x0) {
            lVar37 = *(long *)uVar23;
            _Var14._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            pSVar38 = (SelectionVector *)0x0;
            do {
              pSVar30 = pSVar38;
              if (lVar37 != 0) {
                pSVar30 = (SelectionVector *)(ulong)*(uint *)(lVar37 + (long)pSVar38 * 4);
              }
              pSVar34 = pSVar38;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var14._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar34 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var14._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar38 * 4);
              }
              if ((((float **)local_118[0].sel_vector == (float **)0x0) ||
                  (((ulong)*(float **)((long)local_118[0].sel_vector + ((ulong)pSVar30 >> 6) * 8) >>
                    ((ulong)pSVar30 & 0x3f) & 1) != 0)) &&
                 ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar34 >> 6] >> ((ulong)pSVar34 & 0x3f) & 1) != 0)))) {
                uVar6 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar30 * 0x10))
                        ->_M_use_count;
                uVar18 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar30 * 0x10))
                         ->_M_weak_count;
                left_03.length._4_4_ = uVar18;
                left_03.length._0_4_ = uVar6;
                uVar7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)pdVar12 + pSVar34 * 0x10))->_M_use_count;
                uVar19 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)pdVar12 + pSVar34 * 0x10))->_M_weak_count;
                right_00.length._4_4_ = uVar19;
                right_00.length._0_4_ = uVar7;
                fun_04.lhs_data = (float **)local_78;
                fun_04.func_name = psVar39;
                fun_04.rhs_data = &local_80;
                left_03.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar24 + pSVar30 * 0x10))->
                     _vptr__Sp_counted_base;
                right_00.offset =
                     (uint64_t)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)pdVar12 + pSVar34 * 0x10))->_vptr__Sp_counted_base;
                fVar43 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                   (fun_04,left_03,right_00,in_R8,in_R9);
                *(float *)(pdVar10 + (long)pSVar38 * 4) = fVar43;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_d0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_148,&local_d0);
                  p_Var21 = p_Stack_140;
                  pSVar30 = local_148;
                  local_148 = (SelectionVector *)0x0;
                  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)pSVar30;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var21;
                  if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
                  }
                  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
                  }
                  pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar29->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar20 = (byte)pSVar38 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + ((ulong)pSVar38 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar20 | 0xfffffffffffffffeU >> 0x40 - bVar20);
              }
              pSVar38 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
            } while (local_198 != pSVar38);
          }
          if (local_c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
          }
          if (local_118[0].selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118[0].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        goto LAB_01be00ef;
      }
      plVar11 = (list_entry_t *)vec->data;
      puVar8 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar10 = vec_00->data;
      if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)local_198;
        if ((vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8.sel = local_198;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          _Var31._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_c8.sel = local_198;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)local_128,(unsigned_long **)&vec_00->validity,
                     (unsigned_long *)&local_c8);
          uVar24 = local_128._8_8_;
          uVar23 = local_128._0_8_;
          local_128._0_8_ = (SelectionVector *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var13 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar23;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar24;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
          }
          pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var31._M_head_impl =
               (pTVar29->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             _Var31._M_head_impl;
        if (_Var31._M_head_impl == (unsigned_long *)0x0) {
          if (local_198 != (SelectionVector *)0x0) {
            lVar44 = *plVar11;
            local_188 = (uint64_t *)(pdVar10 + 8);
            pSVar38 = (SelectionVector *)0x0;
            do {
              fun_07.lhs_data = (float **)local_78;
              fun_07.func_name = psVar39;
              fun_07.rhs_data = &local_80;
              right_03.length = *local_188;
              right_03.offset = local_188[-1];
              fVar43 = BinaryLambdaWrapperWithNulls::
                       Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                 (fun_07,lVar44,right_03,in_R8,in_R9);
              *(float *)(pdVar12 + (long)pSVar38 * 4) = fVar43;
              pSVar38 = (SelectionVector *)
                        ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                )._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t + 1);
              local_188 = local_188 + 2;
            } while (local_198 != pSVar38);
          }
        }
        else {
          puVar32 = (undefined1 *)
                    ((long)&local_198[2].selection_data.internal.
                            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 7);
          if ((undefined1 *)0x3f < puVar32) {
            uVar35 = 0;
            pSVar38 = (SelectionVector *)0x0;
            do {
              puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar8 == (unsigned_long *)0x0) {
                uVar36 = 0xffffffffffffffff;
              }
              else {
                uVar36 = puVar8[uVar35];
              }
              pSVar30 = (SelectionVector *)
                        &pSVar38[2].selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
              if (local_198 <= pSVar30) {
                pSVar30 = local_198;
              }
              pSVar34 = pSVar30;
              if (uVar36 != 0) {
                pSVar34 = pSVar38;
                if (uVar36 == 0xffffffffffffffff) {
                  if (pSVar38 < pSVar30) {
                    lVar44 = *plVar11;
                    puVar41 = (uint64_t *)(pdVar10 + (long)pSVar38 * 0x10 + 8);
                    do {
                      fun_05.lhs_data = (float **)local_78;
                      fun_05.func_name = psVar39;
                      fun_05.rhs_data = &local_80;
                      right_01.length = *puVar41;
                      right_01.offset = puVar41[-1];
                      fVar43 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_05,lVar44,right_01,in_R8,in_R9);
                      *(float *)(pdVar12 + (long)pSVar34 * 4) = fVar43;
                      pSVar34 = (SelectionVector *)
                                ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar34->sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                        ._M_t + 1);
                      puVar41 = puVar41 + 2;
                    } while (pSVar30 != pSVar34);
                  }
                }
                else if (pSVar38 < pSVar30) {
                  puVar41 = (uint64_t *)(pdVar10 + (long)pSVar38 * 0x10 + 8);
                  uVar42 = 0;
                  do {
                    if ((uVar36 >> (uVar42 & 0x3f) & 1) != 0) {
                      fun_06.lhs_data = (float **)local_78;
                      fun_06.func_name = psVar39;
                      fun_06.rhs_data = &local_80;
                      right_02.length = *puVar41;
                      right_02.offset = puVar41[-1];
                      fVar43 = BinaryLambdaWrapperWithNulls::
                               Operation<duckdb::ListGenericFold<float,duckdb::NegativeInnerProductOp>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::list_entry_t_const&,duckdb::list_entry_t_const&,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::list_entry_t,duckdb::list_entry_t,float>
                                         (fun_06,*plVar11,right_02,in_R8,in_R9);
                      *(float *)(pdVar12 + uVar42 * 4 + (long)pSVar38 * 4) = fVar43;
                    }
                    uVar42 = uVar42 + 1;
                    puVar41 = puVar41 + 2;
                  } while ((long)pSVar38 + (uVar42 - (long)pSVar30) != 0);
                  pSVar34 = (SelectionVector *)
                            ((long)&(((unsafe_unique_array<unsigned_long> *)&pSVar38->sel_vector)->
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    )._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t + uVar42);
                }
              }
              uVar35 = uVar35 + 1;
              pSVar38 = pSVar34;
            } while (uVar35 != (ulong)puVar32 >> 6);
          }
        }
        goto LAB_01be00ef;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01be00ef:
  bVar25 = DataChunk::AllConstant(local_d8);
  if (bVar25) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	auto count = args.size();

	auto &lhs_vec = args.data[0];
	auto &rhs_vec = args.data[1];

	const auto lhs_count = ListVector::GetListSize(lhs_vec);
	const auto rhs_count = ListVector::GetListSize(rhs_vec);

	auto &lhs_child = ListVector::GetEntry(lhs_vec);
	auto &rhs_child = ListVector::GetEntry(rhs_vec);

	lhs_child.Flatten(lhs_count);
	rhs_child.Flatten(rhs_count);

	D_ASSERT(lhs_child.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rhs_child.GetVectorType() == VectorType::FLAT_VECTOR);

	if (!FlatVector::Validity(lhs_child).CheckAllValid(lhs_count)) {
		throw InvalidInputException("%s: left argument can not contain NULL values", func_name);
	}

	if (!FlatVector::Validity(rhs_child).CheckAllValid(rhs_count)) {
		throw InvalidInputException("%s: right argument can not contain NULL values", func_name);
	}

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);

	BinaryExecutor::ExecuteWithNulls<list_entry_t, list_entry_t, TYPE>(
	    lhs_vec, rhs_vec, result, count,
	    [&](const list_entry_t &left, const list_entry_t &right, ValidityMask &mask, idx_t row_idx) {
		    if (left.length != right.length) {
			    throw InvalidInputException(
			        "%s: list dimensions must be equal, got left length '%d' and right length '%d'", func_name,
			        left.length, right.length);
		    }

		    if (!OP::ALLOW_EMPTY && left.length == 0) {
			    mask.SetInvalid(row_idx);
			    return TYPE();
		    }

		    return OP::Operation(lhs_data + left.offset, rhs_data + right.offset, left.length);
	    });

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}